

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O1

CompressionFunction *
duckdb::FixedSizeUncompressed::GetFunction
          (CompressionFunction *__return_storage_ptr__,PhysicalType data_type)

{
  int iVar1;
  code *pcVar2;
  InternalException *this;
  code *pcVar3;
  code *pcVar4;
  undefined7 in_register_00000031;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  string local_40;
  
  iVar1 = (int)CONCAT71(in_register_00000031,data_type);
  switch(iVar1) {
  case 1:
  case 3:
    pcVar2 = FixedSizeFinalizeAppend<signed_char>;
    pcVar3 = FixedSizeAppend<signed_char,duckdb::StandardFixedSizeAppend>;
    pcVar4 = FixedSizeFetchRow<signed_char>;
    pcVar5 = FixedSizeScanPartial<signed_char>;
    pcVar6 = FixedSizeScan<signed_char>;
    pcVar7 = FixedSizeFinalAnalyze<signed_char>;
    break;
  case 2:
    pcVar2 = FixedSizeFinalizeAppend<unsigned_char>;
    pcVar3 = FixedSizeAppend<unsigned_char,duckdb::StandardFixedSizeAppend>;
    pcVar4 = FixedSizeFetchRow<unsigned_char>;
    pcVar5 = FixedSizeScanPartial<unsigned_char>;
    pcVar6 = FixedSizeScan<unsigned_char>;
    pcVar7 = FixedSizeFinalAnalyze<unsigned_char>;
    break;
  case 4:
    pcVar2 = FixedSizeFinalizeAppend<unsigned_short>;
    pcVar3 = FixedSizeAppend<unsigned_short,duckdb::StandardFixedSizeAppend>;
    pcVar4 = FixedSizeFetchRow<unsigned_short>;
    pcVar5 = FixedSizeScanPartial<unsigned_short>;
    pcVar6 = FixedSizeScan<unsigned_short>;
    pcVar7 = FixedSizeFinalAnalyze<unsigned_short>;
    break;
  case 5:
    pcVar2 = FixedSizeFinalizeAppend<short>;
    pcVar3 = FixedSizeAppend<short,duckdb::StandardFixedSizeAppend>;
    pcVar4 = FixedSizeFetchRow<short>;
    pcVar5 = FixedSizeScanPartial<short>;
    pcVar6 = FixedSizeScan<short>;
    pcVar7 = FixedSizeFinalAnalyze<short>;
    break;
  case 6:
    pcVar2 = FixedSizeFinalizeAppend<unsigned_int>;
    pcVar3 = FixedSizeAppend<unsigned_int,duckdb::StandardFixedSizeAppend>;
    pcVar4 = FixedSizeFetchRow<unsigned_int>;
    pcVar5 = FixedSizeScanPartial<unsigned_int>;
    pcVar6 = FixedSizeScan<unsigned_int>;
    pcVar7 = FixedSizeFinalAnalyze<unsigned_int>;
    break;
  case 7:
    pcVar2 = FixedSizeFinalizeAppend<int>;
    pcVar3 = FixedSizeAppend<int,duckdb::StandardFixedSizeAppend>;
    pcVar4 = FixedSizeFetchRow<int>;
    pcVar5 = FixedSizeScanPartial<int>;
    pcVar6 = FixedSizeScan<int>;
    pcVar7 = FixedSizeFinalAnalyze<int>;
    break;
  case 8:
    pcVar3 = FixedSizeAppend<unsigned_long,duckdb::StandardFixedSizeAppend>;
    goto LAB_00572f5c;
  case 9:
    pcVar2 = FixedSizeFinalizeAppend<long>;
    pcVar3 = FixedSizeAppend<long,duckdb::StandardFixedSizeAppend>;
    pcVar4 = FixedSizeFetchRow<long>;
    pcVar5 = FixedSizeScanPartial<long>;
    pcVar6 = FixedSizeScan<long>;
    pcVar7 = FixedSizeFinalAnalyze<long>;
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
switchD_00572e68_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unsupported type for FixedSizeUncompressed::GetFunction","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    pcVar2 = FixedSizeFinalizeAppend<float>;
    pcVar3 = FixedSizeAppend<float,duckdb::StandardFixedSizeAppend>;
    pcVar4 = FixedSizeFetchRow<float>;
    pcVar5 = FixedSizeScanPartial<float>;
    pcVar6 = FixedSizeScan<float>;
    pcVar7 = FixedSizeFinalAnalyze<float>;
    break;
  case 0xc:
    pcVar2 = FixedSizeFinalizeAppend<double>;
    pcVar3 = FixedSizeAppend<double,duckdb::StandardFixedSizeAppend>;
    pcVar4 = FixedSizeFetchRow<double>;
    pcVar5 = FixedSizeScanPartial<double>;
    pcVar6 = FixedSizeScan<double>;
    pcVar7 = FixedSizeFinalAnalyze<double>;
    break;
  case 0x15:
    pcVar2 = FixedSizeFinalizeAppend<duckdb::interval_t>;
    pcVar3 = FixedSizeAppend<duckdb::interval_t,duckdb::StandardFixedSizeAppend>;
    pcVar4 = FixedSizeFetchRow<duckdb::interval_t>;
    pcVar5 = FixedSizeScanPartial<duckdb::interval_t>;
    pcVar6 = FixedSizeScan<duckdb::interval_t>;
    pcVar7 = FixedSizeFinalAnalyze<duckdb::interval_t>;
    break;
  case 0x17:
    pcVar3 = FixedSizeAppend<unsigned_long,duckdb::ListFixedSizeAppend>;
LAB_00572f5c:
    pcVar2 = FixedSizeFinalizeAppend<unsigned_long>;
    pcVar4 = FixedSizeFetchRow<unsigned_long>;
    pcVar5 = FixedSizeScanPartial<unsigned_long>;
    pcVar6 = FixedSizeScan<unsigned_long>;
    pcVar7 = FixedSizeFinalAnalyze<unsigned_long>;
    break;
  default:
    if (iVar1 == 0xcb) {
      pcVar2 = FixedSizeFinalizeAppend<duckdb::uhugeint_t>;
      pcVar3 = FixedSizeAppend<duckdb::uhugeint_t,duckdb::StandardFixedSizeAppend>;
      pcVar4 = FixedSizeFetchRow<duckdb::uhugeint_t>;
      pcVar5 = FixedSizeScanPartial<duckdb::uhugeint_t>;
      pcVar6 = FixedSizeScan<duckdb::uhugeint_t>;
      pcVar7 = FixedSizeFinalAnalyze<duckdb::uhugeint_t>;
    }
    else {
      if (iVar1 != 0xcc) goto switchD_00572e68_caseD_a;
      pcVar2 = FixedSizeFinalizeAppend<duckdb::hugeint_t>;
      pcVar3 = FixedSizeAppend<duckdb::hugeint_t,duckdb::StandardFixedSizeAppend>;
      pcVar4 = FixedSizeFetchRow<duckdb::hugeint_t>;
      pcVar5 = FixedSizeScanPartial<duckdb::hugeint_t>;
      pcVar6 = FixedSizeScan<duckdb::hugeint_t>;
      pcVar7 = FixedSizeFinalAnalyze<duckdb::hugeint_t>;
    }
  }
  __return_storage_ptr__->type = COMPRESSION_UNCOMPRESSED;
  __return_storage_ptr__->data_type = data_type;
  __return_storage_ptr__->init_analyze = FixedSizeInitAnalyze;
  __return_storage_ptr__->analyze = FixedSizeAnalyze;
  __return_storage_ptr__->final_analyze = pcVar7;
  __return_storage_ptr__->init_compression = UncompressedFunctions::InitCompression;
  __return_storage_ptr__->compress = UncompressedFunctions::Compress;
  __return_storage_ptr__->compress_finalize = UncompressedFunctions::FinalizeCompress;
  __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
  __return_storage_ptr__->init_scan = FixedSizeInitScan;
  __return_storage_ptr__->scan_vector = pcVar6;
  __return_storage_ptr__->scan_partial = pcVar5;
  __return_storage_ptr__->select = (compression_select_t)0x0;
  __return_storage_ptr__->filter = (compression_filter_t)0x0;
  __return_storage_ptr__->fetch_row = pcVar4;
  __return_storage_ptr__->skip = UncompressedFunctions::EmptySkip;
  __return_storage_ptr__->init_segment = (compression_init_segment_t)0x0;
  __return_storage_ptr__->init_append = FixedSizeInitAppend;
  __return_storage_ptr__->append = pcVar3;
  __return_storage_ptr__->finalize_append = pcVar2;
  *(undefined8 *)((long)&__return_storage_ptr__->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->get_segment_info + 1) = 0;
  __return_storage_ptr__->deserialize_state = (compression_deserialize_state_t)0x0;
  __return_storage_ptr__->cleanup_state = (compression_cleanup_state_t)0x0;
  __return_storage_ptr__->revert_append = (compression_revert_append_t)0x0;
  __return_storage_ptr__->serialize_state = (compression_serialize_state_t)0x0;
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction FixedSizeUncompressed::GetFunction(PhysicalType data_type) {
	switch (data_type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return FixedSizeGetFunction<int8_t>(data_type);
	case PhysicalType::INT16:
		return FixedSizeGetFunction<int16_t>(data_type);
	case PhysicalType::INT32:
		return FixedSizeGetFunction<int32_t>(data_type);
	case PhysicalType::INT64:
		return FixedSizeGetFunction<int64_t>(data_type);
	case PhysicalType::UINT8:
		return FixedSizeGetFunction<uint8_t>(data_type);
	case PhysicalType::UINT16:
		return FixedSizeGetFunction<uint16_t>(data_type);
	case PhysicalType::UINT32:
		return FixedSizeGetFunction<uint32_t>(data_type);
	case PhysicalType::UINT64:
		return FixedSizeGetFunction<uint64_t>(data_type);
	case PhysicalType::INT128:
		return FixedSizeGetFunction<hugeint_t>(data_type);
	case PhysicalType::UINT128:
		return FixedSizeGetFunction<uhugeint_t>(data_type);
	case PhysicalType::FLOAT:
		return FixedSizeGetFunction<float>(data_type);
	case PhysicalType::DOUBLE:
		return FixedSizeGetFunction<double>(data_type);
	case PhysicalType::INTERVAL:
		return FixedSizeGetFunction<interval_t>(data_type);
	case PhysicalType::LIST:
		return FixedSizeGetFunction<uint64_t, ListFixedSizeAppend>(data_type);
	default:
		throw InternalException("Unsupported type for FixedSizeUncompressed::GetFunction");
	}
}